

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O0

h__Writer * __thiscall AS_02::ACES::MXFWriter::h__Writer::Finalize(h__Writer *this)

{
  bool bVar1;
  int iVar2;
  ILogSink *this_00;
  long in_RSI;
  undefined1 local_98 [136];
  h__Writer *this_local;
  Result_t *result;
  
  this_local = this;
  bVar1 = ASDCP::MXF::h__WriterState::Test_RUNNING((h__WriterState *)(in_RSI + 0x370));
  if (bVar1) {
    local_98[0x7f] = 0;
    ASDCP::MXF::h__WriterState::Goto_FINAL((h__WriterState *)this);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>::WriteAS02Footer
                ((h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> *)local_98);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_98);
      Kumu::Result_t::~Result_t((Result_t *)local_98);
    }
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"RESULT_STATE RETURNED at %s (%d)\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_ACES.cpp"
               ,0x28c);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

AS_02::Result_t AS_02::ACES::MXFWriter::h__Writer::Finalize()
{

  if(!m_State.Test_RUNNING())
  {
    KM_RESULT_STATE_HERE();
    return RESULT_STATE;
  }

  Result_t result = m_State.Goto_FINAL();

  if(KM_SUCCESS(result))
  {
    result = WriteAS02Footer();
  }

  return result;
}